

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitor_UNIX.cpp
# Opt level: O1

void __thiscall
FIX::SocketMonitor::buildSet(SocketMonitor *this,Sockets *sockets,pollfd *pfds,short events)

{
  _Rb_tree_node_base *p_Var1;
  ulong uVar2;
  _Rb_tree_header *p_Var3;
  
  p_Var1 = (sockets->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(sockets->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var3) {
    uVar2 = 0;
    do {
      pfds[uVar2].fd = p_Var1[1]._M_color;
      pfds[uVar2].events = events;
      pfds[uVar2].revents = 0;
      uVar2 = (ulong)((int)uVar2 + 1);
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var3);
  }
  return;
}

Assistant:

void SocketMonitor::buildSet(const Sockets &sockets, struct pollfd *pfds, short events) {
  Sockets::const_iterator iter;
  unsigned int i = 0;
  for (iter = sockets.begin(); iter != sockets.end(); ++iter) {
    pfds[i].fd = *iter;
    pfds[i].events = events;
    pfds[i].revents = 0;
    i += 1;
  }
}